

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

dxt_image * __thiscall crnlib::dxt_image::operator=(dxt_image *this,dxt_image *rhs)

{
  element *peVar1;
  dxt_image *in_RSI;
  dxt_image *in_RDI;
  dxt_image *this_00;
  dxt_image *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    clear(in_RDI);
    in_RDI->m_width = in_RSI->m_width;
    in_RDI->m_height = in_RSI->m_height;
    in_RDI->m_blocks_x = in_RSI->m_blocks_x;
    in_RDI->m_blocks_y = in_RSI->m_blocks_y;
    in_RDI->m_num_elements_per_block = in_RSI->m_num_elements_per_block;
    in_RDI->m_bytes_per_block = in_RSI->m_bytes_per_block;
    in_RDI->m_format = in_RSI->m_format;
    in_RDI->m_total_blocks = in_RSI->m_total_blocks;
    in_RDI->m_total_elements = in_RSI->m_total_elements;
    in_RDI->m_pElements = (element *)0x0;
    *(undefined8 *)in_RDI->m_element_type = *(undefined8 *)in_RSI->m_element_type;
    *(undefined2 *)in_RDI->m_element_component_index =
         *(undefined2 *)in_RSI->m_element_component_index;
    local_8 = in_RDI;
    if (in_RSI->m_pElements != (element *)0x0) {
      vector<crnlib::dxt_image::element>::resize
                (&this_00->m_elements,(uint)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
      peVar1 = vector<crnlib::dxt_image::element>::operator[](&in_RDI->m_elements,0);
      memcpy(peVar1,in_RSI->m_pElements,(ulong)in_RDI->m_total_elements << 3);
      peVar1 = vector<crnlib::dxt_image::element>::operator[](&in_RDI->m_elements,0);
      in_RDI->m_pElements = peVar1;
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

dxt_image& dxt_image::operator=(const dxt_image& rhs) {
  if (this == &rhs)
    return *this;

  clear();

  m_width = rhs.m_width;
  m_height = rhs.m_height;
  m_blocks_x = rhs.m_blocks_x;
  m_blocks_y = rhs.m_blocks_y;
  m_num_elements_per_block = rhs.m_num_elements_per_block;
  m_bytes_per_block = rhs.m_bytes_per_block;
  m_format = rhs.m_format;
  m_total_blocks = rhs.m_total_blocks;
  m_total_elements = rhs.m_total_elements;
  m_pElements = NULL;
  memcpy(m_element_type, rhs.m_element_type, sizeof(m_element_type));
  memcpy(m_element_component_index, rhs.m_element_component_index, sizeof(m_element_component_index));

  if (rhs.m_pElements) {
    m_elements.resize(m_total_elements);
    memcpy(&m_elements[0], rhs.m_pElements, sizeof(element) * m_total_elements);
    m_pElements = &m_elements[0];
  }

  return *this;
}